

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npp.cpp
# Opt level: O1

void __thiscall pg::NPPSolver::atronsubgamedw(NPPSolver *this)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  Game *pGVar4;
  bitset *pbVar5;
  uint64_t *puVar6;
  uint64_t *puVar7;
  uint64_t *puVar8;
  uint *puVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int *piVar14;
  long lVar15;
  int to;
  ulong uVar16;
  int to_1;
  int to_2;
  int iVar17;
  uint *puVar18;
  int to_3;
  bitset *this_00;
  deque<unsigned_int,_std::allocator<unsigned_int>_> *pdVar19;
  ulong uVar20;
  bool bVar21;
  uint local_80;
  uint local_7c;
  bitset *local_78;
  uint64_t *local_70;
  bitset *local_68;
  deque<unsigned_int,_std::allocator<unsigned_int>_> *local_60;
  long local_58;
  uint64_t *local_50;
  _Map_pointer local_48;
  uint *local_40;
  uint64_t *local_38;
  
  pdVar19 = (this->Heads).
            super__Vector_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start[this->Top];
  local_60 = (deque<unsigned_int,_std::allocator<unsigned_int>_> *)
             ((iterator *)
             ((long)&(pdVar19->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Deque_impl_data + 0x10))->_M_cur;
  local_38 = (uint64_t *)
             ((iterator *)
             ((long)&(pdVar19->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Deque_impl_data + 0x30))->_M_cur;
  if (local_60 != (deque<unsigned_int,_std::allocator<unsigned_int>_> *)local_38) {
    local_70 = *(uint64_t **)
                ((long)&(pdVar19->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Deque_impl_data + 0x20);
    local_48 = *(_Map_pointer *)
                ((long)&(pdVar19->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Deque_impl_data + 0x28);
    do {
      local_58 = (long)(int)(uint)*(uint64_t *)local_60;
      pGVar4 = (this->super_Solver).game;
      piVar14 = pGVar4->_inedges;
      iVar17 = pGVar4->_firstins[local_58];
      uVar2 = piVar14[iVar17];
      if (uVar2 != 0xffffffff) {
        pbVar5 = (this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[this->Top];
        this_00 = (bitset *)
                  (*(long *)&((this->Entries).
                              super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[this->Top]->
                             super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             )._M_impl._M_node + 0x10);
        piVar14 = piVar14 + iVar17;
        local_78 = this_00;
        do {
          uVar11 = (ulong)uVar2;
          uVar16 = (ulong)(int)uVar2;
          puVar6 = (this->outgame)._bits;
          uVar12 = uVar16 >> 6;
          if ((puVar6[uVar12] >> (uVar11 & 0x3f) & 1) == 0) {
            uVar13 = 1L << (uVar11 & 0x3f);
            if ((pbVar5->_bits[uVar12] & uVar13) == 0) {
              pGVar4 = (this->super_Solver).game;
              if (this->alpha == (uint)(((pGVar4->_owner)._bits[uVar12] & uVar13) != 0)) {
                puVar6 = (this->R)._bits;
                uVar11 = puVar6[uVar12];
                if ((uVar11 & uVar13) == 0) {
                  puVar6[uVar12] = uVar11 | uVar13;
                  this->strategy[uVar16] = (int)local_58;
LAB_001583b3:
                  iVar17 = (this->T).pointer;
                  (this->T).pointer = iVar17 + 1;
                  (this->T).queue[iVar17] = uVar2;
                }
                else {
                  puVar6 = (this->O)._bits;
                  uVar11 = puVar6[uVar12];
                  if ((uVar11 & uVar13) != 0) {
                    puVar6[uVar12] = ~uVar13 & uVar11;
                    this->strategy[uVar16] = (int)local_58;
                  }
                }
              }
              else {
                puVar7 = (this->R)._bits;
                if ((puVar7[uVar12] & uVar13) == 0) {
                  uVar3 = pGVar4->_outedges[pGVar4->_firstouts[uVar16]];
                  bVar21 = uVar3 == 0xffffffff;
                  if (!bVar21) {
                    local_68 = (this->Supgame).
                               super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                               _M_impl.super__Vector_impl_data._M_start[this->Top];
                    local_50 = (uint64_t *)(this->E).queue;
                    puVar18 = (uint *)(pGVar4->_outedges + (long)pGVar4->_firstouts[uVar16] + 1);
                    do {
                      uVar16 = (ulong)(long)(int)uVar3 >> 6;
                      bVar10 = false;
                      if (((puVar6[uVar16] >> ((ulong)uVar3 & 0x3f) & 1) == 0) &&
                         (uVar20 = 1L << ((ulong)uVar3 & 0x3f), (puVar7[uVar16] & uVar20) == 0)) {
                        if ((local_68->_bits[uVar16] & uVar20) == 0) {
                          (this->E).pointer = 0;
                          bVar10 = true;
                        }
                        else {
                          iVar17 = (this->E).pointer;
                          (this->E).pointer = iVar17 + 1;
                          *(uint *)((long)local_50 + (long)iVar17 * 4) = uVar3;
                          bVar10 = false;
                        }
                      }
                      if (bVar10) goto LAB_0015839b;
                      uVar3 = *puVar18;
                      puVar18 = puVar18 + 1;
                      bVar21 = uVar3 == 0xffffffff;
                    } while (!bVar21);
                  }
                  iVar17 = (this->E).pointer;
                  lVar15 = (long)iVar17;
                  if (lVar15 != 0) {
                    puVar9 = (this->E).queue;
                    puVar6 = (this->Exits).
                             super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl
                             .super__Vector_impl_data._M_start[this->Pivot]->_bits;
                    do {
                      iVar17 = iVar17 + -1;
                      (this->E).pointer = iVar17;
                      uVar3 = puVar9[lVar15 + -1];
                      puVar1 = puVar6 + (uVar3 >> 6);
                      *puVar1 = *puVar1 | 1L << ((ulong)uVar3 & 0x3f);
                      lVar15 = lVar15 + -1;
                    } while (lVar15 != 0);
                  }
                  this->strategy[uVar11] = -1;
LAB_0015839b:
                  this_00 = local_78;
                  if (bVar21) {
                    puVar7[uVar12] = puVar7[uVar12] | uVar13;
                    goto LAB_001583b3;
                  }
                }
                else {
                  puVar8 = (this->O)._bits;
                  if ((puVar8[uVar12] & uVar13) != 0) {
                    uVar2 = pGVar4->_outedges[pGVar4->_firstouts[uVar16]];
                    bVar21 = uVar2 == 0xffffffff;
                    if (!bVar21) {
                      local_68 = (this->Supgame).
                                 super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[this->Top];
                      local_40 = (this->E).queue;
                      puVar18 = (uint *)(pGVar4->_outedges + (long)pGVar4->_firstouts[uVar16] + 1);
                      do {
                        uVar16 = (ulong)(long)(int)uVar2 >> 6;
                        bVar10 = false;
                        if (((puVar6[uVar16] >> ((ulong)uVar2 & 0x3f) & 1) == 0) &&
                           (uVar20 = 1L << ((ulong)uVar2 & 0x3f), (puVar7[uVar16] & uVar20) == 0)) {
                          if ((local_68->_bits[uVar16] & uVar20) == 0) {
                            (this->E).pointer = 0;
                            bVar10 = true;
                          }
                          else {
                            iVar17 = (this->E).pointer;
                            (this->E).pointer = iVar17 + 1;
                            local_40[iVar17] = uVar2;
                            bVar10 = false;
                          }
                        }
                        if (bVar10) goto LAB_00158241;
                        uVar2 = *puVar18;
                        puVar18 = puVar18 + 1;
                        bVar21 = uVar2 == 0xffffffff;
                      } while (!bVar21);
                    }
                    iVar17 = (this->E).pointer;
                    lVar15 = (long)iVar17;
                    if (lVar15 != 0) {
                      puVar9 = (this->E).queue;
                      puVar6 = (this->Exits).
                               super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                               _M_impl.super__Vector_impl_data._M_start[this->Pivot]->_bits;
                      do {
                        iVar17 = iVar17 + -1;
                        (this->E).pointer = iVar17;
                        uVar2 = puVar9[lVar15 + -1];
                        puVar1 = puVar6 + (uVar2 >> 6);
                        *puVar1 = *puVar1 | 1L << ((ulong)uVar2 & 0x3f);
                        lVar15 = lVar15 + -1;
                      } while (lVar15 != 0);
                    }
                    this->strategy[uVar11] = -1;
LAB_00158241:
                    this_00 = local_78;
                    local_50 = puVar8;
                    if (bVar21) {
                      puVar8[uVar12] = puVar8[uVar12] & ~uVar13;
                    }
                  }
                }
              }
            }
            else {
              local_7c = uVar2;
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,&local_7c);
            }
          }
          uVar2 = piVar14[1];
          piVar14 = piVar14 + 1;
        } while (uVar2 != 0xffffffff);
      }
      local_60 = (deque<unsigned_int,_std::allocator<unsigned_int>_> *)((long)local_60 + 4);
      if (local_60 == (deque<unsigned_int,_std::allocator<unsigned_int>_> *)local_70) {
        local_60 = (deque<unsigned_int,_std::allocator<unsigned_int>_> *)local_48[1];
        local_48 = local_48 + 1;
        local_70 = (uint64_t *)((long)local_60 + 0x200);
      }
    } while (local_60 != (deque<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  }
  iVar17 = (this->T).pointer;
  do {
    if (iVar17 == 0) {
      return;
    }
    (this->T).pointer = iVar17 + -1;
    local_58 = (long)(int)(this->T).queue[(long)iVar17 + -1];
    pGVar4 = (this->super_Solver).game;
    piVar14 = pGVar4->_inedges;
    iVar17 = pGVar4->_firstins[local_58];
    local_80 = piVar14[iVar17];
    if (local_80 != 0xffffffff) {
      pbVar5 = (this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
               _M_impl.super__Vector_impl_data._M_start[this->Top];
      pdVar19 = (deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                (*(long *)&((this->Entries).
                            super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[this->Top]->
                           super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           )._M_impl._M_node + 0x10);
      piVar14 = piVar14 + iVar17;
      local_60 = pdVar19;
      do {
        uVar11 = (ulong)local_80;
        uVar16 = (ulong)(int)local_80;
        puVar6 = (this->outgame)._bits;
        uVar12 = uVar16 >> 6;
        if ((puVar6[uVar12] >> (uVar11 & 0x3f) & 1) == 0) {
          uVar13 = 1L << (uVar11 & 0x3f);
          if ((pbVar5->_bits[uVar12] & uVar13) == 0) {
            pGVar4 = (this->super_Solver).game;
            if (this->alpha == (uint)(((pGVar4->_owner)._bits[uVar12] & uVar13) != 0)) {
              puVar6 = (this->R)._bits;
              uVar11 = puVar6[uVar12];
              if ((uVar11 & uVar13) == 0) {
                puVar6[uVar12] = uVar11 | uVar13;
                this->strategy[uVar16] = (int)local_58;
LAB_001587d7:
                iVar17 = (this->T).pointer;
                (this->T).pointer = iVar17 + 1;
                (this->T).queue[iVar17] = local_80;
              }
              else {
                puVar6 = (this->O)._bits;
                uVar11 = puVar6[uVar12];
                if ((uVar11 & uVar13) != 0) {
                  puVar6[uVar12] = ~uVar13 & uVar11;
                  this->strategy[uVar16] = (int)local_58;
                }
              }
            }
            else {
              puVar7 = (this->R)._bits;
              if ((puVar7[uVar12] & uVar13) == 0) {
                uVar2 = pGVar4->_outedges[pGVar4->_firstouts[uVar16]];
                bVar21 = uVar2 == 0xffffffff;
                if (!bVar21) {
                  local_78 = (this->Supgame).
                             super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl
                             .super__Vector_impl_data._M_start[this->Top];
                  local_70 = (uint64_t *)(this->E).queue;
                  puVar18 = (uint *)(pGVar4->_outedges + (long)pGVar4->_firstouts[uVar16] + 1);
                  do {
                    uVar16 = (ulong)(long)(int)uVar2 >> 6;
                    bVar10 = false;
                    if (((puVar6[uVar16] >> ((ulong)uVar2 & 0x3f) & 1) == 0) &&
                       (uVar20 = 1L << ((ulong)uVar2 & 0x3f), (puVar7[uVar16] & uVar20) == 0)) {
                      if ((local_78->_bits[uVar16] & uVar20) == 0) {
                        (this->E).pointer = 0;
                        bVar10 = true;
                      }
                      else {
                        iVar17 = (this->E).pointer;
                        (this->E).pointer = iVar17 + 1;
                        *(uint *)((long)local_70 + (long)iVar17 * 4) = uVar2;
                        bVar10 = false;
                      }
                    }
                    if (bVar10) goto LAB_001587bf;
                    uVar2 = *puVar18;
                    puVar18 = puVar18 + 1;
                    bVar21 = uVar2 == 0xffffffff;
                  } while (!bVar21);
                }
                iVar17 = (this->E).pointer;
                lVar15 = (long)iVar17;
                if (lVar15 != 0) {
                  puVar9 = (this->E).queue;
                  puVar6 = (this->Exits).
                           super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
                           super__Vector_impl_data._M_start[this->Pivot]->_bits;
                  do {
                    iVar17 = iVar17 + -1;
                    (this->E).pointer = iVar17;
                    uVar2 = puVar9[lVar15 + -1];
                    puVar1 = puVar6 + (uVar2 >> 6);
                    *puVar1 = *puVar1 | 1L << ((ulong)uVar2 & 0x3f);
                    lVar15 = lVar15 + -1;
                  } while (lVar15 != 0);
                }
                this->strategy[uVar11] = -1;
LAB_001587bf:
                pdVar19 = local_60;
                if (bVar21) {
                  puVar7[uVar12] = puVar7[uVar12] | uVar13;
                  goto LAB_001587d7;
                }
              }
              else {
                puVar8 = (this->O)._bits;
                if ((puVar8[uVar12] & uVar13) != 0) {
                  uVar2 = pGVar4->_outedges[pGVar4->_firstouts[uVar16]];
                  bVar21 = uVar2 == 0xffffffff;
                  if (!bVar21) {
                    local_78 = (this->Supgame).
                               super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                               _M_impl.super__Vector_impl_data._M_start[this->Top];
                    local_68 = (bitset *)(this->E).queue;
                    puVar18 = (uint *)(pGVar4->_outedges + (long)pGVar4->_firstouts[uVar16] + 1);
                    do {
                      uVar16 = (ulong)(long)(int)uVar2 >> 6;
                      bVar10 = false;
                      if (((puVar6[uVar16] >> ((ulong)uVar2 & 0x3f) & 1) == 0) &&
                         (uVar20 = 1L << ((ulong)uVar2 & 0x3f), (puVar7[uVar16] & uVar20) == 0)) {
                        if ((local_78->_bits[uVar16] & uVar20) == 0) {
                          (this->E).pointer = 0;
                          bVar10 = true;
                        }
                        else {
                          iVar17 = (this->E).pointer;
                          (this->E).pointer = iVar17 + 1;
                          *(uint *)((long)&local_68->_bits + (long)iVar17 * 4) = uVar2;
                          bVar10 = false;
                        }
                      }
                      if (bVar10) goto LAB_00158668;
                      uVar2 = *puVar18;
                      puVar18 = puVar18 + 1;
                      bVar21 = uVar2 == 0xffffffff;
                    } while (!bVar21);
                  }
                  iVar17 = (this->E).pointer;
                  lVar15 = (long)iVar17;
                  if (lVar15 != 0) {
                    puVar9 = (this->E).queue;
                    puVar6 = (this->Exits).
                             super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl
                             .super__Vector_impl_data._M_start[this->Pivot]->_bits;
                    do {
                      iVar17 = iVar17 + -1;
                      (this->E).pointer = iVar17;
                      uVar2 = puVar9[lVar15 + -1];
                      puVar1 = puVar6 + (uVar2 >> 6);
                      *puVar1 = *puVar1 | 1L << ((ulong)uVar2 & 0x3f);
                      lVar15 = lVar15 + -1;
                    } while (lVar15 != 0);
                  }
                  this->strategy[uVar11] = -1;
LAB_00158668:
                  pdVar19 = local_60;
                  local_70 = puVar8;
                  if (bVar21) {
                    puVar8[uVar12] = puVar8[uVar12] & ~uVar13;
                  }
                }
              }
            }
          }
          else {
            std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (pdVar19,&local_80);
          }
        }
        local_80 = piVar14[1];
        piVar14 = piVar14 + 1;
      } while (local_80 != 0xffffffff);
    }
    iVar17 = (this->T).pointer;
  } while( true );
}

Assistant:

void NPPSolver::atronsubgamedw()
{
    auto & heads = *(Heads[Top]);
    auto qend = heads.end();
    for (auto qiter = heads.begin(); qiter != qend; ++qiter)
    {
        pushinqueueonsubgamedw(*qiter);
    }
    while (T.nonempty())
    {
        pushinqueueonsubgamedw(T.pop());
    }
}